

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_image_t *poVar1;
  opj_simple_mcc_decorrelation_data_t *poVar2;
  opj_mct_data_t *poVar3;
  OPJ_INT32 event_type;
  opj_j2k_t *poVar4;
  OPJ_UINT32 OVar5;
  opj_tcp_t *poVar6;
  OPJ_FLOAT32 *pOVar7;
  void *ptr;
  int iVar8;
  OPJ_INT32 *pOVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  OPJ_UINT32 l_nb_stages;
  OPJ_UINT32 l_tmp;
  opj_j2k_t *local_38;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x18e1,
                  "OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x18e2,
                  "OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x18e3,
                  "OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar6 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar6 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size == 0) {
    event_type = 1;
  }
  else {
    poVar1 = p_j2k->m_private_image;
    opj_read_bytes_LE(p_header_data,&l_nb_stages,1);
    if (1 < l_nb_stages) {
      opj_event_msg(p_manager,2,"Cannot take in charge multiple transformation stages.\n");
      return 1;
    }
    if (l_nb_stages + 1 == p_header_size) {
      OVar5 = poVar1->numcomps;
      pOVar9 = &poVar6->tccps->m_dc_level_shift;
      while (bVar12 = OVar5 != 0, OVar5 = OVar5 - 1, bVar12) {
        *pOVar9 = 0;
        pOVar9 = pOVar9 + 0x10e;
      }
      if (poVar6->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
        opj_free(poVar6->m_mct_decoding_matrix);
        poVar6->m_mct_decoding_matrix = (OPJ_FLOAT32 *)0x0;
      }
      uVar11 = 0;
      local_38 = p_j2k;
      do {
        poVar4 = local_38;
        if (l_nb_stages <= uVar11) {
          return 1;
        }
        p_header_data = p_header_data + 1;
        opj_read_bytes_LE(p_header_data,&l_tmp,1);
        poVar1 = poVar4->m_private_image;
        poVar2 = poVar6->m_mcc_records;
        iVar8 = poVar6->m_nb_mcc_records + 1;
        do {
          iVar8 = iVar8 + -1;
          if (iVar8 == 0) goto LAB_0011d5b6;
        } while (poVar2->m_index != l_tmp);
        OVar5 = poVar2->m_nb_comps;
        if (OVar5 == poVar1->numcomps) {
          poVar3 = poVar2->m_decorrelation_array;
          if (poVar3 != (opj_mct_data_t *)0x0) {
            OVar5 = OVar5 * OVar5;
            if (poVar3->m_data_size != MCT_ELEMENT_SIZE[poVar3->m_element_type] * OVar5) {
              return 0;
            }
            pOVar7 = (OPJ_FLOAT32 *)opj_malloc((ulong)(OVar5 * 4));
            poVar6->m_mct_decoding_matrix = pOVar7;
            if (pOVar7 == (OPJ_FLOAT32 *)0x0) {
              return 0;
            }
            (*j2k_mct_read_functions_to_float[poVar3->m_element_type])(poVar3->m_data,pOVar7,OVar5);
          }
          poVar3 = poVar2->m_offset_array;
          if (poVar3 != (opj_mct_data_t *)0x0) {
            OVar5 = poVar1->numcomps;
            if (poVar3->m_data_size != MCT_ELEMENT_SIZE[poVar3->m_element_type] * OVar5) {
              return 0;
            }
            ptr = opj_malloc((ulong)(OVar5 * 4));
            if (ptr == (void *)0x0) {
              return 0;
            }
            (*j2k_mct_read_functions_to_int32[poVar3->m_element_type])(poVar3->m_data,ptr,OVar5);
            OVar5 = poVar1->numcomps;
            pOVar9 = &poVar6->tccps->m_dc_level_shift;
            for (lVar10 = 0; OVar5 != (OPJ_UINT32)lVar10; lVar10 = lVar10 + 1) {
              *pOVar9 = *(OPJ_INT32 *)((long)ptr + lVar10 * 4);
              pOVar9 = pOVar9 + 0x10e;
            }
            opj_free(ptr);
          }
        }
LAB_0011d5b6:
        uVar11 = uVar11 + 1;
      } while( true );
    }
    event_type = 2;
  }
  opj_event_msg(p_manager,event_type,"Error reading MCO marker\n");
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 l_tmp, i;
    OPJ_UINT32 l_nb_stages;
    opj_tcp_t * l_tcp;
    opj_tccp_t * l_tccp;
    opj_image_t * l_image;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_image = p_j2k->m_private_image;
    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    if (p_header_size < 1) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCO marker\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_nb_stages,
                   1);                         /* Nmco : only one transform stage*/
    ++p_header_data;

    if (l_nb_stages > 1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple transformation stages.\n");
        return OPJ_TRUE;
    }

    if (p_header_size != l_nb_stages + 1) {
        opj_event_msg(p_manager, EVT_WARNING, "Error reading MCO marker\n");
        return OPJ_FALSE;
    }

    l_tccp = l_tcp->tccps;

    for (i = 0; i < l_image->numcomps; ++i) {
        l_tccp->m_dc_level_shift = 0;
        ++l_tccp;
    }

    if (l_tcp->m_mct_decoding_matrix) {
        opj_free(l_tcp->m_mct_decoding_matrix);
        l_tcp->m_mct_decoding_matrix = 00;
    }

    for (i = 0; i < l_nb_stages; ++i) {
        opj_read_bytes(p_header_data, &l_tmp, 1);
        ++p_header_data;

        if (! opj_j2k_add_mct(l_tcp, p_j2k->m_private_image, l_tmp)) {
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}